

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O2

void __thiscall
SRCTools::ResamplerModel::CascadeStage::getOutputSamples
          (CascadeStage *this,FloatSample *outBuffer,uint length)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint length_local;
  FloatSample *outBuffer_local;
  
  puVar1 = &this->size;
  length_local = length;
  outBuffer_local = outBuffer;
  while (length_local != 0) {
    if (*puVar1 == 0) {
      uVar3 = (*this->resamplerStage->_vptr_ResamplerStage[2])
                        (this->resamplerStage,(ulong)length_local);
      this->size = uVar3;
      uVar2 = 1;
      if ((uVar3 == 0) || (uVar2 = 0x1000, 0x1000 < uVar3)) {
        uVar3 = uVar2;
        *puVar1 = uVar3;
      }
      (*this->source->_vptr_FloatSampleProvider[2])(this->source,this->buffer,(ulong)uVar3);
      this->bufferPtr = this->buffer;
    }
    (*this->resamplerStage->_vptr_ResamplerStage[3])
              (this->resamplerStage,&this->bufferPtr,puVar1,&outBuffer_local,&length_local);
  }
  return;
}

Assistant:

void CascadeStage::getOutputSamples(FloatSample *outBuffer, unsigned int length) {
	while (length > 0) {
		if (size == 0) {
			size = resamplerStage.estimateInLength(length);
			if (size < 1) {
				size = 1;
			} else if (MAX_SAMPLES_PER_RUN < size) {
				size = MAX_SAMPLES_PER_RUN;
			}
			source.getOutputSamples(buffer, size);
			bufferPtr = buffer;
		}
		resamplerStage.process(bufferPtr, size, outBuffer, length);
	}
}